

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O0

void helicsPublicationPublishBoolean(HelicsPublication pub,HelicsBool val,HelicsError *err)

{
  PublicationObject *pPVar1;
  PublicationObject *pubObj;
  bool in_stack_000000df;
  Publication *in_stack_000000e0;
  HelicsError *in_stack_ffffffffffffffd0;
  HelicsPublication in_stack_ffffffffffffffd8;
  
  pPVar1 = anon_unknown.dwarf_5d1c2::verifyPublication
                     (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  if (pPVar1 != (PublicationObject *)0x0) {
    helics::Publication::publish(in_stack_000000e0,in_stack_000000df);
  }
  return;
}

Assistant:

void helicsPublicationPublishBoolean(HelicsPublication pub, HelicsBool val, HelicsError* err)
{
    auto* pubObj = verifyPublication(pub, err);
    if (pubObj == nullptr) {
        return;
    }
    try {
        pubObj->pubPtr->publish((val != HELICS_FALSE));
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}